

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaNNUnit.cpp
# Opt level: O0

uint __thiscall NaNNUnit::Neurons(NaNNUnit *this,uint iLayer)

{
  uint uVar1;
  undefined4 *puVar2;
  uint in_ESI;
  NaNNUnit *in_RDI;
  uint local_4;
  
  uVar1 = Layers(in_RDI);
  if (in_ESI < uVar1 - 1) {
    local_4 = (in_RDI->descr).nHidNeurons[in_ESI];
  }
  else {
    uVar1 = Layers(in_RDI);
    if (in_ESI != uVar1 - 1) {
      puVar2 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar2 = 1;
      __cxa_throw(puVar2,&NaException::typeinfo,0);
    }
    local_4 = (in_RDI->descr).nOutNeurons;
  }
  return local_4;
}

Assistant:

unsigned
NaNNUnit::Neurons (unsigned iLayer) const
{
    if(iLayer < Layers() - 1)
        return descr.nHidNeurons[iLayer];
    else if(iLayer == Layers() - 1)
        return descr.nOutNeurons;

    throw(na_out_of_range);

    /* make compiler happy */
    return 0;
}